

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BifFileReader.cpp
# Opt level: O1

void __thiscall BifFileReader<NWN::ResRef16>::ParseBifFile(BifFileReader<NWN::ResRef16> *this)

{
  FileWrapper *this_00;
  pointer *pp_Var1;
  iterator __position;
  uint uVar2;
  ULONGLONG UVar3;
  runtime_error *this_01;
  ulong uVar4;
  BIF_RESOURCE Key;
  BIF_HEADER Header;
  _BIF_RESOURCE local_54;
  int local_44;
  int local_40;
  uint local_3c;
  uint local_34;
  
  this_00 = &this->m_FileWrapper;
  FileWrapper::ReadFile(this_00,&local_44,0x14,"Header");
  uVar2 = 0x100000;
  if (local_3c < 0x100000) {
    uVar2 = local_3c;
  }
  std::
  vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
  ::reserve(&this->m_ResDir,(ulong)uVar2);
  if (local_44 == 0x46464942) {
    if (local_40 == 0x20203156) {
      uVar4 = (ulong)local_34;
      if ((this->m_FileWrapper).m_View == (uchar *)0x0) {
        if ((FILE *)this_00->m_File == (FILE *)0x0) {
          UVar3 = 0;
        }
        else {
          fseek((FILE *)this_00->m_File,0,2);
          UVar3 = ftell((FILE *)this_00->m_File);
          fseek((FILE *)this_00->m_File,0,0);
        }
      }
      else {
        UVar3 = (this->m_FileWrapper).m_Size;
      }
      if (UVar3 != uVar4) {
        FileWrapper::SeekOffset(this_00,(ulong)local_34,"VariableTableOffset");
        if (local_3c != 0) {
          uVar4 = 0;
          do {
            FileWrapper::ReadFile(this_00,&local_54,0x10,"Key");
            if (uVar4 != (local_54.ID & 0xfffff)) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_01,"Key.ID mismatch");
              goto LAB_0015eb8e;
            }
            if (CARRY4(local_54.FileSize,local_54.Offset)) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_01,"Key.Offset overflow");
              goto LAB_0015eb8e;
            }
            if (this->m_FileSize < (ulong)local_54.FileSize + (ulong)local_54.Offset) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_01,"BIF KEY entry exceeds file size");
              goto LAB_0015eb8e;
            }
            __position._M_current =
                 (this->m_ResDir).
                 super__Vector_base<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->m_ResDir).
                super__Vector_base<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>>
              ::_M_realloc_insert<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE_const&>
                        ((vector<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>>
                          *)&this->m_ResDir,__position,&local_54);
            }
            else {
              (__position._M_current)->ID = local_54.ID;
              (__position._M_current)->Offset = local_54.Offset;
              (__position._M_current)->FileSize = local_54.FileSize;
              (__position._M_current)->ResourceType = local_54.ResourceType;
              pp_Var1 = &(this->m_ResDir).
                         super__Vector_base<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pp_Var1 = *pp_Var1 + 1;
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < local_3c);
        }
      }
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Header.Version is not V1 (illegal BIF file)");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Header.FileType is not BIFF (illegal BIF file)");
  }
LAB_0015eb8e:
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
BifFileReader< ResRefT >::ParseBifFile(
	)
/*++

Routine Description:

	This routine parses the directory structures of a BIF file and generates
	the in-memory key and resource list entry directories.

Arguments:

	None.

Return Value:

	None.  On failure, the routine raises an std::exception.

Environment:

	User mode.

--*/
{
	BIF_HEADER Header;

	m_FileWrapper.ReadFile( &Header, sizeof( Header ), "Header" );

	if (Header.VariableResourceCount < 1024 * 1024)
		m_ResDir.reserve( Header.VariableResourceCount );
	else
		m_ResDir.reserve( 1024 * 1024 );

	if (memcmp( &Header.FileType, "BIFF", 4 ))
		throw std::runtime_error( "Header.FileType is not BIFF (illegal BIF file)" );
	if (memcmp( &Header.Version, "V1  ", 4 ))
		throw std::runtime_error( "Header.Version is not V1 (illegal BIF file)" );

	if (Header.VariableTableOffset == m_FileWrapper.GetFileSize())
	{
		//Empty BIF file, skip
		return;
	}

	m_FileWrapper.SeekOffset( Header.VariableTableOffset, "VariableTableOffset" );

	for (unsigned long i = 0; i < Header.VariableResourceCount; i += 1)
	{
		BIF_RESOURCE Key;

		m_FileWrapper.ReadFile( &Key, sizeof( Key ), "Key" );

		if ((ResID) i != (ResID) (Key.ID & 0xFFFFF))
			throw std::runtime_error( "Key.ID mismatch" );

		if (Key.Offset + Key.FileSize < Key.Offset)
			throw std::runtime_error( "Key.Offset overflow" );

		if ((ULONGLONG) Key.Offset + Key.FileSize > (ULONGLONG) m_FileSize)
			throw std::runtime_error( "BIF KEY entry exceeds file size" );

		m_ResDir.push_back( Key );
	}
}